

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMTrack.cpp
# Opt level: O1

void __thiscall
Storage::Disk::PCMTrack::add_segment
          (PCMTrack *this,Time *start_time,PCMSegment *segment,bool clamp_to_index_hole)

{
  _Bit_type *p_Var1;
  ulong *puVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  byte bVar10;
  PCMSegment *pPVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  uint64_t clock_rate;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  uint64_t length;
  long lVar22;
  char cVar23;
  uint uVar24;
  ulong uVar25;
  Time local_38;
  
  pPVar11 = PCMSegmentEventSource::segment
                      ((this->segment_event_sources_).
                       super__Vector_base<Storage::Disk::PCMSegmentEventSource,_std::allocator<Storage::Disk::PCMSegmentEventSource>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  Time::Time(&local_38,
             (ulong)((*(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     *(int *)&(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) *
             (ulong)(segment->length_of_a_bit).length,(ulong)(segment->length_of_a_bit).clock_rate);
  if (local_38.length == 0) {
    local_38 = *start_time;
  }
  else {
    clock_rate = (uint64_t)start_time->clock_rate;
    if (start_time->clock_rate == local_38.clock_rate) {
      length = ((ulong)local_38 & 0xffffffff) + (ulong)start_time->length;
    }
    else {
      length = ((ulong)local_38 & 0xffffffff) * clock_rate +
               (ulong)start_time->length * ((ulong)local_38 >> 0x20);
      clock_rate = clock_rate * ((ulong)local_38 >> 0x20);
    }
    Time::Time(&local_38,length,clock_rate);
  }
  puVar21 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar15 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar24 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar16 = (ulong)uVar24 + ((long)puVar15 - (long)puVar21) * 8;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = start_time->length * uVar16;
  auVar7 = auVar7 / ZEXT416(start_time->clock_rate);
  uVar12 = auVar7._0_8_;
  uVar13 = (((ulong)local_38 & 0xffffffff) * uVar16) / ((ulong)local_38 >> 0x20);
  uVar20 = uVar13 - uVar12;
  uVar14 = uVar20 / (((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                     (long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 0x10 +
                    (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset * 2
                    );
  bVar10 = auVar7[0];
  if ((clamp_to_index_hole) || (uVar13 <= uVar16)) {
    if (uVar16 < uVar13) {
      uVar13 = uVar16;
    }
    uVar16 = uVar12 + 0x3f;
    if (-1 < (long)uVar12) {
      uVar16 = uVar12;
    }
    uVar25 = (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001);
    uVar18 = uVar13 + 0x3f;
    if (-1 < (long)uVar13) {
      uVar18 = uVar13;
    }
    puVar15 = puVar21 + ((long)uVar16 >> 6) + uVar25 + -1;
    uVar17 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
    uVar24 = (uint)uVar13 & 0x3f;
    cVar23 = (char)uVar24;
    if (puVar21 + ((long)uVar16 >> 6) + uVar25 == puVar21 + ((long)uVar18 >> 6) + uVar17) {
      if ((auVar7._0_4_ & 0x3f) == uVar24) goto LAB_0044ae19;
      uVar16 = ((0xffffffffffffffffU >> (-cVar23 & 0x3fU)) >> (bVar10 & 0x3f)) << (bVar10 & 0x3f);
    }
    else {
      if ((auVar7 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
        *puVar15 = *puVar15 & ~(-1L << (bVar10 & 0x3f));
        puVar15 = puVar21 + ((long)uVar16 >> 6) + uVar25;
      }
      memset(puVar15,0,(long)(puVar21 + ((long)uVar18 >> 6) + (uVar17 - 1)) - (long)puVar15);
      if ((uVar13 & 0x3f) == 0) goto LAB_0044ae19;
      uVar16 = 0xffffffffffffffff >> (-cVar23 & 0x3fU);
      puVar15 = puVar21 + ((long)uVar18 >> 6) + (uVar17 - 1);
    }
    *puVar15 = *puVar15 & ~uVar16;
LAB_0044ae19:
    p_Var3 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar16 = ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3)
             * 8 + (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    if (uVar16 != 0) {
      p_Var4 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var1 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar24 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      uVar13 = 0;
      do {
        uVar18 = uVar13 + 0x3f;
        if (-1 < (long)uVar13) {
          uVar18 = uVar13;
        }
        if ((p_Var3[((long)uVar18 >> 6) +
                    (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar13 & 0x3f) & 1) != 0) {
          uVar18 = (uVar13 * uVar20) / uVar16 + uVar14 + uVar12;
          if ((ulong)uVar24 + ((long)p_Var1 - (long)p_Var4) * 8 <= uVar18) {
            return;
          }
          uVar25 = uVar18 + 0x3f;
          if (-1 < (long)uVar18) {
            uVar25 = uVar18;
          }
          puVar21 = p_Var4 + ((long)uVar25 >> 6) +
                             (ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) +
                             0xffffffffffffffff;
          *puVar21 = *puVar21 | 1L << ((byte)uVar18 & 0x3f);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar16);
    }
    return;
  }
  if (uVar20 < uVar16) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar16;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar13;
    auVar8 = auVar8 % auVar5;
    uVar18 = auVar8._0_8_;
    uVar16 = uVar18 + 0x3f;
    if (-1 < (long)uVar18) {
      uVar16 = uVar18;
    }
    puVar15 = puVar21 + ((long)uVar16 >> 6) +
                        ((ulong)((uVar18 & 0x800000000000003f) < 0x8000000000000001) - 1);
    if (puVar21 != puVar15) {
      memset(puVar21,0,(long)puVar15 - (long)puVar21);
      puVar21 = puVar15;
    }
    if ((auVar8 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
      *puVar21 = *puVar21 & ~(0xffffffffffffffffU >> (-(auVar8[0] & 0x3f) & 0x3f));
    }
    uVar16 = uVar12 + 0x3f;
    if (-1 < (long)uVar12) {
      uVar16 = uVar12;
    }
    puVar15 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
              ((long)uVar16 >> 6) + (ulong)((uVar12 & 0x800000000000003f) < 0x8000000000000001);
    puVar21 = puVar15 + -1;
    puVar2 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar24 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    cVar23 = (char)uVar24;
    if (puVar21 == puVar2) {
      if ((auVar7._0_4_ & 0x3f) == uVar24) goto LAB_0044afd1;
      uVar16 = ((0xffffffffffffffffU >> (-cVar23 & 0x3fU)) >> (bVar10 & 0x3f)) << (bVar10 & 0x3f);
    }
    else {
      if ((auVar7 & (undefined1  [16])0x3f) != (undefined1  [16])0x0) {
        *puVar21 = *puVar21 & ~(-1L << (bVar10 & 0x3f));
        puVar21 = puVar15;
      }
      memset(puVar21,0,(long)puVar2 - (long)puVar21);
      puVar21 = puVar2;
joined_r0x0044add9:
      if (uVar24 == 0) goto LAB_0044afd1;
      uVar16 = 0xffffffffffffffff >> (-cVar23 & 0x3fU);
    }
  }
  else {
    cVar23 = (char)uVar24;
    if (puVar21 != puVar15) {
      memset(puVar21,0,(long)puVar15 - (long)puVar21);
      puVar21 = puVar15;
      goto joined_r0x0044add9;
    }
    if (uVar24 == 0) goto LAB_0044afd1;
    uVar16 = 0xffffffffffffffff >> (-cVar23 & 0x3fU);
  }
  *puVar21 = *puVar21 & ~uVar16;
LAB_0044afd1:
  p_Var3 = (segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar16 = (ulong)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(segment->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) *
           8;
  lVar22 = uVar16 - 1;
  if (lVar22 < 0) {
    return;
  }
  p_Var4 = (pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar18 = (ulong)(pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
           ((long)(pPVar11->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var4) *
           8;
  uVar25 = uVar16;
  do {
    uVar25 = uVar25 - 1;
    if ((p_Var3[uVar25 >> 6] >> (uVar25 & 0x3f) & 1) != 0) {
      uVar17 = (lVar22 * uVar20) / uVar16 + uVar14 + uVar12;
      if (uVar17 < uVar13 - uVar18) {
        return;
      }
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar18;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar17;
      uVar19 = SUB168(auVar9 % auVar6,0);
      uVar17 = uVar19 + 0x3f;
      if (-1 < (long)uVar19) {
        uVar17 = uVar19;
      }
      puVar21 = p_Var4 + ((long)uVar17 >> 6) +
                         (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) +
                         0xffffffffffffffff;
      *puVar21 = *puVar21 | 1L << (SUB161(auVar9 % auVar6,0) & 0x3f);
    }
    lVar22 = lVar22 + -1;
  } while (0 < (long)uVar25);
  return;
}

Assistant:

void PCMTrack::add_segment(const Time &start_time, const PCMSegment &segment, bool clamp_to_index_hole) {
	// Get a reference to the destination.
	PCMSegment &destination = segment_event_sources_.front().segment();

	// Determine the range to fill on the target segment.
	const Time end_time = start_time + segment.length();
	const size_t start_bit = start_time.length * destination.data.size() / start_time.clock_rate;
	const size_t end_bit = end_time.length * destination.data.size() / end_time.clock_rate;
	const size_t target_width = end_bit - start_bit;
	const size_t half_offset = target_width / (2 * segment.data.size());

	if(clamp_to_index_hole || end_bit <= destination.data.size()) {
		// If clamping is applied, just write a single segment, from the start_bit to whichever is
		// closer of the end of track and the end_bit.
		const size_t selected_end_bit = std::min(end_bit, destination.data.size());

		// Reset the destination.
		std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.begin() + ptrdiff_t(selected_end_bit), false);

		// Step through the source data from start to finish, stopping early if it goes out of bounds.
		for(size_t bit = 0; bit < segment.data.size(); ++bit) {
			if(segment.data[bit]) {
				const size_t output_bit = start_bit + half_offset + (bit * target_width) / segment.data.size();
				if(output_bit >= destination.data.size()) return;
				destination.data[output_bit] = true;
			}
		}
	} else {
		// Clamping is not enabled, so the supplied segment loops over the index hole, arbitrarily many times.
		// So work backwards unless or until the original start position is reached, then stop.

		// This definitely runs over the index hole; check whether the whole track needs clearing, or whether
		// a centre segment is untouched.
		if(target_width >= destination.data.size()) {
			std::fill(destination.data.begin(), destination.data.end(), false);
		} else {
			std::fill(destination.data.begin(), destination.data.begin() + ptrdiff_t(end_bit % destination.data.size()), false);
			std::fill(destination.data.begin() + ptrdiff_t(start_bit), destination.data.end(), false);
		}

		// Run backwards from final bit back to first, stopping early if overlapping the beginning.
		for(auto bit = ptrdiff_t(segment.data.size()-1); bit >= 0; --bit) {
			// Store flux transitions only; non-transitions can be ignored.
			if(segment.data[size_t(bit)]) {
				// Map to the proper output destination; stop if now potentially overwriting where we began.
				const size_t output_bit = start_bit + half_offset + (size_t(bit) * target_width) / segment.data.size();
				if(output_bit < end_bit - destination.data.size()) return;

				// Store.
				destination.data[output_bit % destination.data.size()] = true;
			}
		}
	}
}